

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_socket.c
# Opt level: O2

cio_error cio_server_socket_init
                    (cio_server_socket *server_socket,cio_eventloop *loop,uint backlog,
                    cio_address_family family,cio_alloc_client_t alloc_client,
                    cio_free_client_t free_client,uint64_t close_timeout_ns,
                    cio_server_socket_close_hook_t close_hook)

{
  int iVar1;
  cio_error cVar2;
  int *piVar3;
  
  iVar1 = cio_linux_socket_create(family);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    cVar2 = -*piVar3;
  }
  else {
    (server_socket->impl).ev.fd = iVar1;
    (server_socket->impl).close_timeout_ns = close_timeout_ns;
    server_socket->alloc_client = alloc_client;
    server_socket->free_client = free_client;
    (server_socket->impl).loop = loop;
    server_socket->close_hook = close_hook;
    server_socket->backlog = backlog;
    cVar2 = CIO_SUCCESS;
  }
  return cVar2;
}

Assistant:

enum cio_error cio_server_socket_init(struct cio_server_socket *server_socket,
                                      struct cio_eventloop *loop,
                                      unsigned int backlog,
                                      enum cio_address_family family,
                                      cio_alloc_client_t alloc_client,
                                      cio_free_client_t free_client,
                                      uint64_t close_timeout_ns,
                                      cio_server_socket_close_hook_t close_hook)
{
	int listen_fd = cio_linux_socket_create(family);
	if (cio_unlikely(listen_fd == -1)) {
		return (enum cio_error)(-errno);
	}

	server_socket->impl.ev.fd = listen_fd;
	server_socket->impl.close_timeout_ns = close_timeout_ns;

	server_socket->alloc_client = alloc_client;
	server_socket->free_client = free_client;
	server_socket->impl.loop = loop;
	server_socket->close_hook = close_hook;
	server_socket->backlog = (int)backlog;
	return CIO_SUCCESS;
}